

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O3

void __thiscall kj::TopLevelProcessContext::exit(TopLevelProcessContext *this,int __status)

{
  bool bVar1;
  uint *puVar2;
  undefined4 in_register_00000034;
  
  bVar1 = this->hadErrors;
  if (this->cleanShutdown == true) {
    puVar2 = (uint *)__cxa_allocate_exception(4,CONCAT44(in_register_00000034,__status));
    *puVar2 = (uint)bVar1;
    __cxa_throw(puVar2,&CleanShutdownException::typeinfo,0);
  }
  _exit((uint)bVar1);
}

Assistant:

void TopLevelProcessContext::exit() {
  int exitCode = hadErrors ? 1 : 0;
  if (cleanShutdown) {
#if KJ_NO_EXCEPTIONS
    // This is the best we can do.
    warning("warning: KJ_CLEAN_SHUTDOWN may not work correctly when compiled "
            "with -fno-exceptions.");
    ::exit(exitCode);
#else
    throw CleanShutdownException { exitCode };
#endif
  }
  _exit(exitCode);
}